

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpTest_HostFunc_PingPong_SameThread_Test::TestBody
          (InterpTest_HostFunc_PingPong_SameThread_Test *this)

{
  initializer_list<wabt::interp::Value> __l;
  initializer_list<wabt::interp::Ref> __l_00;
  initializer_list<wabt::Type> __l_01;
  initializer_list<wabt::Type> __l_02;
  initializer_list<unsigned_char> __l_03;
  bool bVar1;
  HostFunc *this_00;
  DefinedFunc *this_01;
  char *pcVar2;
  reference this_02;
  AssertHelper local_338;
  Message local_330;
  u32 local_328;
  uint local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_2;
  Message local_308;
  size_type local_300;
  uint local_2f4;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2d8;
  Message local_2d0;
  Enum local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar;
  anon_union_16_6_113bff37_for_Value_0 local_2a8;
  anon_union_16_6_113bff37_for_Value_0 *local_298;
  size_type local_290;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_288;
  Ptr local_270;
  Result local_254;
  undefined1 local_250 [4];
  Result result;
  Ptr trap;
  Values results;
  Ref local_218;
  iterator local_210;
  size_type local_208;
  vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> local_200;
  anon_class_8_1_8991fb9c local_1e8;
  Callback local_1e0;
  allocator<wabt::Type> local_1b9;
  Type local_1b8;
  iterator local_1b0;
  size_type local_1a8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_1a0;
  allocator<wabt::Type> local_181;
  Type local_180;
  iterator local_178;
  size_type local_170;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_168;
  FuncType local_150;
  undefined1 local_110 [8];
  Ptr host_func;
  Thread thread;
  uchar local_68 [48];
  iterator local_38;
  size_type local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  InterpTest_HostFunc_PingPong_SameThread_Test *local_10;
  InterpTest_HostFunc_PingPong_SameThread_Test *this_local;
  
  local_10 = this;
  memcpy(local_68,&DAT_0030d5c3,0x30);
  local_38 = local_68;
  local_30 = 0x30;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)
             ((long)&thread.trace_source_._M_t.
                     super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
                     .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false> + 7));
  __l_03._M_len = local_30;
  __l_03._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,__l_03,
             (allocator_type *)
             ((long)&thread.trace_source_._M_t.
                     super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
                     .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false> + 7));
  InterpTest::ReadModule(&this->super_InterpTest,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&thread.trace_source_._M_t.
                     super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
                     .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false> + 7));
  wabt::interp::Thread::Thread
            ((Thread *)&host_func.root_index_,&(this->super_InterpTest).store_,(Stream *)0x0);
  wabt::Type::Type(&local_180,I32);
  local_178 = &local_180;
  local_170 = 1;
  std::allocator<wabt::Type>::allocator(&local_181);
  __l_02._M_len = local_170;
  __l_02._M_array = local_178;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_168,__l_02,&local_181);
  wabt::Type::Type(&local_1b8,I32);
  local_1b0 = &local_1b8;
  local_1a8 = 1;
  std::allocator<wabt::Type>::allocator(&local_1b9);
  __l_01._M_len = local_1a8;
  __l_01._M_array = local_1b0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_1a0,__l_01,&local_1b9);
  wabt::interp::FuncType::FuncType(&local_150,&local_168,&local_1a0);
  local_1e8.this = this;
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_HostFunc_PingPong_SameThread_Test::TestBody()::__0,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&local_1e0,&local_1e8);
  wabt::interp::HostFunc::New
            ((Ptr *)local_110,&(this->super_InterpTest).store_,&local_150,&local_1e0);
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_1e0);
  wabt::interp::FuncType::~FuncType(&local_150);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_1a0);
  std::allocator<wabt::Type>::~allocator(&local_1b9);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_168);
  std::allocator<wabt::Type>::~allocator(&local_181);
  this_00 = wabt::interp::RefPtr<wabt::interp::HostFunc>::operator->
                      ((RefPtr<wabt::interp::HostFunc> *)local_110);
  local_218 = wabt::interp::Object::self((Object *)this_00);
  local_210 = &local_218;
  local_208 = 1;
  std::allocator<wabt::interp::Ref>::allocator
            ((allocator<wabt::interp::Ref> *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __l_00._M_len = local_208;
  __l_00._M_array = local_210;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
            (&local_200,__l_00,
             (allocator_type *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  InterpTest::Instantiate(&this->super_InterpTest,&local_200);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector(&local_200);
  std::allocator<wabt::interp::Ref>::~allocator
            ((allocator<wabt::interp::Ref> *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)local_250);
  InterpTest::GetFuncExport(&local_270,&this->super_InterpTest,0);
  this_01 = wabt::interp::RefPtr<wabt::interp::DefinedFunc>::operator->(&local_270);
  local_2a8.v128_.v = (v128)wabt::interp::Value::Make(1);
  local_298 = &local_2a8;
  local_290 = 1;
  std::allocator<wabt::interp::Value>::allocator
            ((allocator<wabt::interp::Value> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  __l._M_len = local_290;
  __l._M_array = (iterator)local_298;
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            (&local_288,__l,
             (allocator_type *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_254 = wabt::interp::Func::Call
                        (&this_01->super_Func,(Thread *)&host_func.root_index_,&local_288,
                         (Values *)&trap.root_index_,(Ptr *)local_250);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_288);
  std::allocator<wabt::interp::Value>::~allocator
            ((allocator<wabt::interp::Value> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_270);
  local_2c4 = Ok;
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_2c0,"Result::Ok","result",&local_2c4,&local_254);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x176,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    testing::Message::~Message(&local_2d0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_2f4 = 1;
    local_300 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                          ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                           &trap.root_index_);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_2f0,"1u","results.size()",&local_2f4,&local_300);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
    if (!bVar1) {
      testing::Message::Message(&local_308);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x177,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_308);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_308);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
    local_324 = 0xb;
    this_02 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                        ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                         &trap.root_index_,0);
    local_328 = wabt::interp::Value::Get<unsigned_int>(this_02);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_320,"11u","results[0].Get<u32>()",&local_324,&local_328);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
    if (!bVar1) {
      testing::Message::Message(&local_330);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
      testing::internal::AssertHelper::AssertHelper
                (&local_338,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x178,pcVar2);
      testing::internal::AssertHelper::operator=(&local_338,&local_330);
      testing::internal::AssertHelper::~AssertHelper(&local_338);
      testing::Message::~Message(&local_330);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)local_250);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_110)
  ;
  wabt::interp::Thread::~Thread((Thread *)&host_func.root_index_);
  return;
}

Assistant:

TEST_F(InterpTest, HostFunc_PingPong_SameThread) {
  // (import "" "f" (func $f (param i32) (result i32)))
  // (func (export "g") (param i32) (result i32)
  //   (call $f (i32.add (local.get 0) (i32.const 1))))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x06, 0x01, 0x60,
      0x01, 0x7f, 0x01, 0x7f, 0x02, 0x06, 0x01, 0x00, 0x01, 0x66, 0x00, 0x00,
      0x03, 0x02, 0x01, 0x00, 0x07, 0x05, 0x01, 0x01, 0x67, 0x00, 0x01, 0x0a,
      0x0b, 0x01, 0x09, 0x00, 0x20, 0x00, 0x41, 0x01, 0x6a, 0x10, 0x00, 0x0b,
  });

  Thread thread(store_);

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [&](Thread& t, const Values& params, Values& results,
                        Trap::Ptr* out_trap) -> Result {
                      auto val = params[0].Get<u32>();
                      if (val < 10) {
                        return GetFuncExport(0)->Call(t, {Value::Make(val * 2)},
                                                      results, out_trap);
                      }
                      results[0] = Value::Make(val);
                      return Result::Ok;
                    });

  Instantiate({host_func->self()});

  // Should produce the following calls:
  //  g(1) -> f(2) -> g(4) -> f(5) -> g(10) -> f(11) -> return 11

  Values results;
  Trap::Ptr trap;
  Result result =
      GetFuncExport(0)->Call(thread, {Value::Make(1)}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(11u, results[0].Get<u32>());
}